

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(cmGeneratorExpressionDAGChecker *this)

{
  bool bVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  cmGeneratorExpressionDAGChecker *top;
  
  do {
    pcVar2 = this;
    this = pcVar2->Parent;
  } while (this != (cmGeneratorExpressionDAGChecker *)0x0);
  bVar1 = std::operator==(&pcVar2->Property,"INTERFACE_POSITION_INDEPENDENT_CODE");
  return bVar1;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingPICExpression()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  return top->Property == "INTERFACE_POSITION_INDEPENDENT_CODE";
}